

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaValidateFacets
              (xmlSchemaAbstractCtxtPtr actxt,xmlNodePtr node,xmlSchemaTypePtr type,
              xmlSchemaValType valType,xmlChar *value,xmlSchemaValPtr val,unsigned_long length,
              int fireErrors)

{
  xmlSchemaTypeType xVar1;
  bool bVar2;
  xmlSchemaWhitespaceValueType local_74;
  unsigned_long uStack_70;
  xmlSchemaWhitespaceValueType ws;
  unsigned_long len;
  xmlSchemaFacetPtr facet;
  xmlSchemaFacetLinkPtr facetLink;
  xmlSchemaTypePtr tmpType;
  int local_48;
  int found;
  int error;
  int ret;
  xmlSchemaValPtr val_local;
  xmlChar *value_local;
  xmlSchemaTypePtr pxStack_28;
  xmlSchemaValType valType_local;
  xmlSchemaTypePtr type_local;
  xmlNodePtr node_local;
  xmlSchemaAbstractCtxtPtr actxt_local;
  
  local_48 = 0;
  uStack_70 = 0;
  if (type->type == XML_SCHEMA_TYPE_BASIC) {
    return 0;
  }
  _error = val;
  val_local = (xmlSchemaValPtr)value;
  value_local._4_4_ = valType;
  pxStack_28 = type;
  type_local = (xmlSchemaTypePtr)node;
  node_local = (xmlNodePtr)actxt;
  if (type->facetSet != (xmlSchemaFacetLinkPtr)0x0) {
    if ((type->flags & 0x100U) == 0) {
      if ((type->flags & 0x40U) == 0) goto LAB_001f8347;
    }
    else {
      facetLink = (xmlSchemaFacetLinkPtr)xmlSchemaGetPrimitiveType(type);
      if ((((xmlSchemaTypePtr)facetLink)->builtInType == 1) ||
         ((((xmlSchemaTypePtr)facetLink)->type == XML_SCHEMA_TYPE_BASIC &&
          (((xmlSchemaTypePtr)facetLink)->builtInType == 0x2e)))) {
        local_74 = xmlSchemaGetWhiteSpaceFacetValue(pxStack_28);
      }
      else {
        local_74 = XML_SCHEMA_WHITESPACE_COLLAPSE;
      }
      if (_error != (xmlSchemaValPtr)0x0) {
        value_local._4_4_ = xmlSchemaGetValType(_error);
      }
      for (facet = (xmlSchemaFacetPtr)pxStack_28->facetSet; found = 0,
          facet != (xmlSchemaFacetPtr)0x0; facet = *(xmlSchemaFacetPtr *)facet) {
        xVar1 = facet->next->type;
        if (2 < xVar1 - XML_SCHEMA_FACET_PATTERN) {
          if (xVar1 - XML_SCHEMA_FACET_LENGTH < 3) {
            found = xmlSchemaValidateLengthFacetWhtsp
                              (facet->next,value_local._4_4_,(xmlChar *)val_local,_error,
                               &stack0xffffffffffffff90,local_74);
          }
          else {
            found = xmlSchemaValidateFacetWhtsp
                              (facet->next,local_74,value_local._4_4_,(xmlChar *)val_local,_error,
                               local_74);
          }
          if (found < 0) {
            xmlSchemaInternalErr
                      ((xmlSchemaAbstractCtxtPtr)node_local,"xmlSchemaValidateFacets",
                       "validating against a atomic type facet");
            return -1;
          }
          if (0 < found) {
            if (fireErrors == 0) {
              return found;
            }
            xmlSchemaFacetErr((xmlSchemaAbstractCtxtPtr)node_local,found,(xmlNodePtr)type_local,
                              (xmlChar *)val_local,uStack_70,pxStack_28,facet->next,(char *)0x0,
                              (xmlChar *)0x0,(xmlChar *)0x0);
            if (local_48 == 0) {
              local_48 = found;
            }
          }
        }
      }
    }
    if ((pxStack_28->flags & 0x40U) != 0) {
      for (facet = (xmlSchemaFacetPtr)pxStack_28->facetSet; found = 0,
          facet != (xmlSchemaFacetPtr)0x0; facet = *(xmlSchemaFacetPtr *)facet) {
        if (facet->next->type - XML_SCHEMA_FACET_LENGTH < 3) {
          found = xmlSchemaValidateListSimpleTypeFacet
                            (facet->next,(xmlChar *)val_local,length,(unsigned_long *)0x0);
          if (found < 0) {
            xmlSchemaInternalErr
                      ((xmlSchemaAbstractCtxtPtr)node_local,"xmlSchemaValidateFacets",
                       "validating against a list type facet");
            return -1;
          }
          if (0 < found) {
            if (fireErrors == 0) {
              return found;
            }
            xmlSchemaFacetErr((xmlSchemaAbstractCtxtPtr)node_local,found,(xmlNodePtr)type_local,
                              (xmlChar *)val_local,length,pxStack_28,facet->next,(char *)0x0,
                              (xmlChar *)0x0,(xmlChar *)0x0);
            if (local_48 == 0) {
              local_48 = found;
            }
          }
        }
      }
    }
  }
LAB_001f8347:
  tmpType._4_4_ = 0;
  found = 0;
  facetLink = (xmlSchemaFacetLinkPtr)pxStack_28;
  do {
    for (len = (unsigned_long)facetLink[7].facet; len != 0; len = *(unsigned_long *)(len + 8)) {
      if (*(int *)len == 0x3ef) {
        tmpType._4_4_ = 1;
        found = xmlSchemaAreValuesEqual(*(xmlSchemaValPtr *)(len + 0x38),_error);
        if (found == 1) break;
        if (found < 0) {
          xmlSchemaInternalErr
                    ((xmlSchemaAbstractCtxtPtr)node_local,"xmlSchemaValidateFacets",
                     "validating against an enumeration facet");
          return -1;
        }
      }
    }
    if ((found != 0) || (tmpType._4_4_ != 0)) break;
    facetLink = facetLink[7].next;
    bVar2 = false;
    if (facetLink != (xmlSchemaFacetLinkPtr)0x0) {
      bVar2 = *(int *)&facetLink->next != 1;
    }
  } while (bVar2);
  if ((tmpType._4_4_ != 0) && (found == 0)) {
    found = 0x730;
    if (fireErrors == 0) {
      return 0x730;
    }
    xmlSchemaFacetErr((xmlSchemaAbstractCtxtPtr)node_local,XML_SCHEMAV_CVC_ENUMERATION_VALID,
                      (xmlNodePtr)type_local,(xmlChar *)val_local,0,pxStack_28,
                      (xmlSchemaFacetPtr)0x0,(char *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
    if (local_48 == 0) {
      local_48 = found;
    }
  }
  facetLink = (xmlSchemaFacetLinkPtr)pxStack_28;
  len = 0;
  do {
    tmpType._4_4_ = 0;
    for (facet = (xmlSchemaFacetPtr)facetLink[0xb].next; facet != (xmlSchemaFacetPtr)0x0;
        facet = *(xmlSchemaFacetPtr *)facet) {
      if (facet->next->type == XML_SCHEMA_FACET_PATTERN) {
        tmpType._4_4_ = 1;
        found = xmlRegexpExec(facet->next->regexp,(xmlChar *)val_local);
        if (found == 1) break;
        if (found < 0) {
          xmlSchemaInternalErr
                    ((xmlSchemaAbstractCtxtPtr)node_local,"xmlSchemaValidateFacets",
                     "validating against a pattern facet");
          return -1;
        }
        len = (unsigned_long)facet->next;
      }
    }
    if ((tmpType._4_4_ != 0) && (found != 1)) {
      found = 0x72f;
      if (fireErrors == 0) {
        return 0x72f;
      }
      xmlSchemaFacetErr((xmlSchemaAbstractCtxtPtr)node_local,XML_SCHEMAV_CVC_PATTERN_VALID,
                        (xmlNodePtr)type_local,(xmlChar *)val_local,0,pxStack_28,
                        (xmlSchemaFacetPtr)len,(char *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      if (local_48 != 0) {
        return local_48;
      }
      return found;
    }
    facetLink = facetLink[7].next;
    bVar2 = false;
    if (facetLink != (xmlSchemaFacetLinkPtr)0x0) {
      bVar2 = *(int *)&facetLink->next != 1;
    }
    if (!bVar2) {
      return local_48;
    }
  } while( true );
}

Assistant:

static int
xmlSchemaValidateFacets(xmlSchemaAbstractCtxtPtr actxt,
			xmlNodePtr node,
			xmlSchemaTypePtr type,
			xmlSchemaValType valType,
			const xmlChar * value,
			xmlSchemaValPtr val,
			unsigned long length,
			int fireErrors)
{
    int ret, error = 0, found;

    xmlSchemaTypePtr tmpType;
    xmlSchemaFacetLinkPtr facetLink;
    xmlSchemaFacetPtr facet;
    unsigned long len = 0;
    xmlSchemaWhitespaceValueType ws;

    /*
    * In Libxml2, derived built-in types have currently no explicit facets.
    */
    if (type->type == XML_SCHEMA_TYPE_BASIC)
	return (0);

    /*
    * NOTE: Do not jump away, if the facetSet of the given type is
    * empty: until now, "pattern" and "enumeration" facets of the
    * *base types* need to be checked as well.
    */
    if (type->facetSet == NULL)
	goto pattern_and_enum;

    if (! WXS_IS_ATOMIC(type)) {
	if (WXS_IS_LIST(type))
	    goto WXS_IS_LIST;
	else
	    goto pattern_and_enum;
    }

    /*
    * Whitespace handling is only of importance for string-based
    * types.
    */
    tmpType = xmlSchemaGetPrimitiveType(type);
    if ((tmpType->builtInType == XML_SCHEMAS_STRING) ||
	WXS_IS_ANY_SIMPLE_TYPE(tmpType)) {
	ws = xmlSchemaGetWhiteSpaceFacetValue(type);
    } else
	ws = XML_SCHEMA_WHITESPACE_COLLAPSE;

    /*
    * If the value was not computed (for string or
    * anySimpleType based types), then use the provided
    * type.
    */
    if (val != NULL)
	valType = xmlSchemaGetValType(val);

    ret = 0;
    for (facetLink = type->facetSet; facetLink != NULL;
	facetLink = facetLink->next) {
	/*
	* Skip the pattern "whiteSpace": it is used to
	* format the character content beforehand.
	*/
	switch (facetLink->facet->type) {
	    case XML_SCHEMA_FACET_WHITESPACE:
	    case XML_SCHEMA_FACET_PATTERN:
	    case XML_SCHEMA_FACET_ENUMERATION:
		continue;
	    case XML_SCHEMA_FACET_LENGTH:
	    case XML_SCHEMA_FACET_MINLENGTH:
	    case XML_SCHEMA_FACET_MAXLENGTH:
		ret = xmlSchemaValidateLengthFacetWhtsp(facetLink->facet,
		    valType, value, val, &len, ws);
		break;
	    default:
		ret = xmlSchemaValidateFacetWhtsp(facetLink->facet, ws,
		    valType, value, val, ws);
		break;
	}
	if (ret < 0) {
	    AERROR_INT("xmlSchemaValidateFacets",
		"validating against a atomic type facet");
	    return (-1);
	} else if (ret > 0) {
	    if (fireErrors)
		xmlSchemaFacetErr(actxt, ret, node,
		value, len, type, facetLink->facet, NULL, NULL, NULL);
	    else
		return (ret);
	    if (error == 0)
		error = ret;
	}
	ret = 0;
    }

WXS_IS_LIST:
    if (! WXS_IS_LIST(type))
	goto pattern_and_enum;
    /*
    * "length", "minLength" and "maxLength" of list types.
    */
    ret = 0;
    for (facetLink = type->facetSet; facetLink != NULL;
	facetLink = facetLink->next) {

	switch (facetLink->facet->type) {
	    case XML_SCHEMA_FACET_LENGTH:
	    case XML_SCHEMA_FACET_MINLENGTH:
	    case XML_SCHEMA_FACET_MAXLENGTH:
		ret = xmlSchemaValidateListSimpleTypeFacet(facetLink->facet,
		    value, length, NULL);
		break;
	    default:
		continue;
	}
	if (ret < 0) {
	    AERROR_INT("xmlSchemaValidateFacets",
		"validating against a list type facet");
	    return (-1);
	} else if (ret > 0) {
	    if (fireErrors)
		xmlSchemaFacetErr(actxt, ret, node,
		value, length, type, facetLink->facet, NULL, NULL, NULL);
	    else
		return (ret);
	    if (error == 0)
		error = ret;
	}
	ret = 0;
    }

pattern_and_enum:
    found = 0;
    /*
    * Process enumerations. Facet values are in the value space
    * of the defining type's base type. This seems to be a bug in the
    * XML Schema 1.0 spec. Use the whitespace type of the base type.
    * Only the first set of enumerations in the ancestor-or-self axis
    * is used for validation.
    */
    ret = 0;
    tmpType = type;
    do {
        for (facet = tmpType->facets; facet != NULL; facet = facet->next) {
            if (facet->type != XML_SCHEMA_FACET_ENUMERATION)
                continue;
            found = 1;
            ret = xmlSchemaAreValuesEqual(facet->val, val);
            if (ret == 1)
                break;
            else if (ret < 0) {
                AERROR_INT("xmlSchemaValidateFacets",
                    "validating against an enumeration facet");
                return (-1);
            }
        }
        if (ret != 0)
            break;
        /*
        * Break on the first set of enumerations. Any additional
        *  enumerations which might be existent on the ancestors
        *  of the current type are restricted by this set; thus
        *  *must* *not* be taken into account.
        */
        if (found)
            break;
        tmpType = tmpType->baseType;
    } while ((tmpType != NULL) &&
        (tmpType->type != XML_SCHEMA_TYPE_BASIC));
    if (found && (ret == 0)) {
        ret = XML_SCHEMAV_CVC_ENUMERATION_VALID;
        if (fireErrors) {
            xmlSchemaFacetErr(actxt, ret, node,
                value, 0, type, NULL, NULL, NULL, NULL);
        } else
            return (ret);
        if (error == 0)
            error = ret;
    }

    /*
    * Process patters. Pattern facets are ORed at type level
    * and ANDed if derived. Walk the base type axis.
    */
    tmpType = type;
    facet = NULL;
    do {
        found = 0;
        for (facetLink = tmpType->facetSet; facetLink != NULL;
            facetLink = facetLink->next) {
            if (facetLink->facet->type != XML_SCHEMA_FACET_PATTERN)
                continue;
            found = 1;
            /*
            * NOTE that for patterns, @value needs to be the
            * normalized value.
            */
            ret = xmlRegexpExec(facetLink->facet->regexp, value);
            if (ret == 1)
                break;
            else if (ret < 0) {
                AERROR_INT("xmlSchemaValidateFacets",
                    "validating against a pattern facet");
                return (-1);
            } else {
                /*
                * Save the last non-validating facet.
                */
                facet = facetLink->facet;
            }
        }
        if (found && (ret != 1)) {
            ret = XML_SCHEMAV_CVC_PATTERN_VALID;
            if (fireErrors) {
                xmlSchemaFacetErr(actxt, ret, node,
                    value, 0, type, facet, NULL, NULL, NULL);
            } else
                return (ret);
            if (error == 0)
                error = ret;
            break;
        }
        tmpType = tmpType->baseType;
    } while ((tmpType != NULL) && (tmpType->type != XML_SCHEMA_TYPE_BASIC));

    return (error);
}